

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  AssertionResult *in_stack_ffffffffffffffc8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x26197a);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)*in_RDI,' ');
    AssertionResult::getExpression_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator<<(poVar2,local_28);
    std::__cxx11::string::~string(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << ' ' << result.getExpression();
        }
    }